

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erfunc.c
# Opt level: O3

double erfc1__(int ind,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = ABS(x);
  if (dVar1 <= 0.5) {
    dVar1 = x * x;
    dVar3 = (0.5 - (((((dVar1 * 7.7105849500132e-05 + -0.00133733772997339) * dVar1 +
                      0.0323076579225834) * dVar1 + 0.0479137145607681) * dVar1 + 0.128379167095513
                    + 1.0) / (((dVar1 * 0.00301048631703895 + 0.0538971687740286) * dVar1 +
                              0.375795757275549) * dVar1 + 1.0)) * x) + 0.5;
    if (ind == 0) {
      return dVar3;
    }
    dVar1 = exp(dVar1);
    return dVar3 * dVar1;
  }
  if (dVar1 <= 4.0) {
    dVar1 = (((((((dVar1 * -1.36864857382717e-07 + 0.564195517478974) * dVar1 + 7.21175825088309) *
                 dVar1 + 43.1622272220567) * dVar1 + 152.98928504694) * dVar1 + 339.320816734344) *
              dVar1 + 451.918953711873) * dVar1 + 300.459261020162) /
            (((((((dVar1 + 12.7827273196294) * dVar1 + 77.0001529352295) * dVar1 + 277.585444743988)
                * dVar1 + 638.980264465631) * dVar1 + 931.35409485061) * dVar1 + 790.950925327898) *
             dVar1 + 300.459260956983);
  }
  else {
    if (x <= -5.6) {
      if (ind != 0) {
        dVar1 = exp(x * x);
        return dVar1 + dVar1;
      }
      return 2.0;
    }
    if (ind == 0) {
      if (100.0 < x) {
        return 0.0;
      }
      if (708.3893345680835 < x * x) {
        return 0.0;
      }
    }
    dVar3 = 1.0 / (x * x);
    dVar1 = (0.564189583547756 -
            (((((dVar3 * 2.10144126479064 + 26.2370141675169) * dVar3 + 21.3688200555087) * dVar3 +
              4.6580782871847) * dVar3 + 0.282094791773523) * dVar3) /
            ((((dVar3 * 94.153775055546 + 187.11481179959) * dVar3 + 99.0191814623914) * dVar3 +
             18.0124575948747) * dVar3 + 1.0)) / dVar1;
  }
  if (ind == 0) {
    dVar3 = x * x;
    dVar2 = exp(-dVar3);
    dVar1 = dVar1 * dVar2 * ((dVar3 - dVar3) + 0.5 + 0.5);
    if (x < 0.0) {
      dVar1 = 2.0 - dVar1;
    }
  }
  else if (x < 0.0) {
    dVar3 = exp(x * x);
    dVar1 = (dVar3 + dVar3) - dVar1;
  }
  return dVar1;
}

Assistant:

double erfc1__(int ind, double x)
{
/* ----------------------------------------------------------------------- */
/*         EVALUATION OF THE COMPLEMENTARY ERROR FUNCTION */

/*          ERFC1(IND,X) = ERFC(X)            IF IND = 0 */
/*          ERFC1(IND,X) = EXP(X*X)*ERFC(X)   OTHERWISE */
/* ----------------------------------------------------------------------- */

    /* Initialized data */

    double c = .564189583547756;
    double a[5] = { 7.7105849500132e-5,-.00133733772997339,
	    .0323076579225834,.0479137145607681,.128379167095513 };
    double b[3] = { .00301048631703895,.0538971687740286,
	    .375795757275549 };
    double p[8] = { -1.36864857382717e-7,.564195517478974,
	    7.21175825088309,43.1622272220567,152.98928504694,
	    339.320816734344,451.918953711873,300.459261020162 };
    double q[8] = { 1.,12.7827273196294,77.0001529352295,
	    277.585444743988,638.980264465631,931.35409485061,
	    790.950925327898,300.459260956983 };
    double r[5] = { 2.10144126479064,26.2370141675169,
	    21.3688200555087,4.6580782871847,.282094791773523 };
    double s[4] = { 94.153775055546,187.11481179959,
	    99.0191814623914,18.0124575948747 };

    double ret_val;
    double e, t, w, bot, top;

    double ax = fabs(x);
    //				|X| <= 0.5 */
    if (ax <= 0.5) {
	double t = x * x,
	    top = (((a[0] * t + a[1]) * t + a[2]) * t + a[3]) * t + a[4] + 1.0,
	    bot = ((b[0] * t + b[1]) * t + b[2]) * t + 1.0;
	ret_val = 0.5 - x * (top / bot) + 0.5;
	if (ind != 0) {
	    ret_val = exp(t) * ret_val;
	}
	return ret_val;
    }
    // else (L10:):		0.5 < |X| <= 4
    if (ax <= 4.0) {
	top = ((((((p[0] * ax + p[1]) * ax + p[2]) * ax + p[3]) * ax + p[4]) * ax
		+ p[5]) * ax + p[6]) * ax + p[7];
	bot = ((((((q[0] * ax + q[1]) * ax + q[2]) * ax + q[3]) * ax + q[4]) * ax
		+ q[5]) * ax + q[6]) * ax + q[7];
	ret_val = top / bot;

    } else { //			|X| > 4
	// L20:
	if (x <= -5.6) {
	    // L50:            	LIMIT VALUE FOR "LARGE" NEGATIVE X
	    ret_val = 2.0;
	    if (ind != 0) {
		ret_val = exp(x * x) * 2.0;
	    }
	    return ret_val;
	}
	if (ind == 0 && (x > 100.0 || x * x > -exparg(1))) {
	    // LIMIT VALUE FOR LARGE POSITIVE X   WHEN IND = 0
	    // L60:
	    return 0.0;
	}

	// L30:
	t = 1. / (x * x);
	top = (((r[0] * t + r[1]) * t + r[2]) * t + r[3]) * t + r[4];
	bot = (((s[0] * t + s[1]) * t + s[2]) * t + s[3]) * t + 1.0;
	ret_val = (c - t * top / bot) / ax;
    }

    // L40:                 FINAL ASSEMBLY
    if (ind != 0) {
	if (x < 0.0)
	    ret_val = exp(x * x) * 2.0 - ret_val;
    } else {
	// L41:  ind == 0 :
	w = x * x;
	t = w;
	e = w - t;
	ret_val = (0.5 - e + 0.5) * exp(-t) * ret_val;
	if (x < 0.0)
	    ret_val = 2.0 - ret_val;
    }
    return ret_val;

}